

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CLogOpExp *exp)

{
  TypeInfo *left;
  IExpression *pIVar1;
  TPrimitiveType _type;
  bool bVar2;
  TypeInfo *in_RCX;
  string *this_00;
  undefined1 auStack_78 [8];
  string local_70;
  string errorMessage;
  
  std::operator<<((ostream *)&std::cout,"typechecker: clogopexp\n");
  pIVar1 = (exp->leftOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 == (IExpression *)0x0) {
    CError::CError((CError *)auStack_78,&CError::AST_ERROR_abi_cxx11_,
                   &(exp->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)auStack_78);
    std::__cxx11::string::~string((string *)auStack_78);
    TypeInfo::TypeInfo((TypeInfo *)auStack_78,ERROR_TYPE);
  }
  else {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    left = &this->lastCalculatedType;
    TypeInfo::TypeInfo((TypeInfo *)auStack_78,ERROR_TYPE);
    bVar2 = operator==(left,(TypeInfo *)auStack_78);
    std::__cxx11::string::~string((string *)(auStack_78 + 8));
    if (bVar2) {
      return;
    }
    TypeInfo::TypeInfo((TypeInfo *)auStack_78,BOOLEAN);
    bVar2 = operator!=(left,(TypeInfo *)auStack_78);
    std::__cxx11::string::~string((string *)(auStack_78 + 8));
    if (bVar2) {
      TypeInfo::TypeInfo((TypeInfo *)auStack_78,BOOLEAN);
      CError::GetTypeErrorMessage_abi_cxx11_(&errorMessage,(CError *)auStack_78,left,in_RCX);
      std::__cxx11::string::~string((string *)(auStack_78 + 8));
      CError::CError((CError *)auStack_78,&errorMessage,
                     &(exp->super_IExpression).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)auStack_78);
      std::__cxx11::string::~string((string *)auStack_78);
      TypeInfo::TypeInfo((TypeInfo *)auStack_78,ERROR_TYPE);
LAB_0011b332:
      TypeInfo::operator=(left,(TypeInfo *)auStack_78);
      std::__cxx11::string::~string((string *)(auStack_78 + 8));
      this_00 = &errorMessage;
      goto LAB_0011b3a0;
    }
    pIVar1 = (exp->rightOperand)._M_t.
             super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
             super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
             super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
    if (pIVar1 == (IExpression *)0x0) {
      CError::CError((CError *)auStack_78,&CError::AST_ERROR_abi_cxx11_,
                     &(exp->super_IExpression).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)auStack_78);
      std::__cxx11::string::~string((string *)auStack_78);
      _type = ERROR_TYPE;
    }
    else {
      (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
      TypeInfo::TypeInfo((TypeInfo *)auStack_78,ERROR_TYPE);
      bVar2 = operator==(left,(TypeInfo *)auStack_78);
      std::__cxx11::string::~string((string *)(auStack_78 + 8));
      if (bVar2) {
        return;
      }
      TypeInfo::TypeInfo((TypeInfo *)auStack_78,BOOLEAN);
      bVar2 = operator!=(left,(TypeInfo *)auStack_78);
      std::__cxx11::string::~string((string *)(auStack_78 + 8));
      if (bVar2) {
        TypeInfo::TypeInfo((TypeInfo *)auStack_78,BOOLEAN);
        CError::GetTypeErrorMessage_abi_cxx11_(&errorMessage,(CError *)auStack_78,left,in_RCX);
        std::__cxx11::string::~string((string *)(auStack_78 + 8));
        CError::CError((CError *)auStack_78,&errorMessage,
                       &(exp->super_IExpression).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)auStack_78);
        std::__cxx11::string::~string((string *)auStack_78);
        TypeInfo::TypeInfo((TypeInfo *)auStack_78,ERROR_TYPE);
        goto LAB_0011b332;
      }
      _type = BOOLEAN;
    }
    TypeInfo::TypeInfo((TypeInfo *)auStack_78,_type);
  }
  TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)auStack_78);
  this_00 = (string *)(auStack_78 + 8);
LAB_0011b3a0:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CLogOpExp &exp ) 
{
    std::cout << "typechecker: clogopexp\n";

    if( exp.leftOperand ) {
		exp.leftOperand->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
	} else {
        errors.push_back( CError( CError::AST_ERROR, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
        return;
    }

	if( lastCalculatedType != enums::TPrimitiveType::BOOLEAN ) {
		auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::BOOLEAN, lastCalculatedType );
		errors.push_back( CError( errorMessage, exp.position ) );
		lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
		return;
	}

	if( exp.rightOperand ) {
		exp.rightOperand->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
	} else {
        errors.push_back( CError( CError::AST_ERROR, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
        return;
    }

	if( lastCalculatedType != enums::TPrimitiveType::BOOLEAN ) {
		auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::BOOLEAN, lastCalculatedType );
		errors.push_back( CError( errorMessage, exp.position));
		lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
		return;
	}
	lastCalculatedType = enums::TPrimitiveType::BOOLEAN;
}